

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1029e4::DiskInterfaceTestRemoveFile::Run(DiskInterfaceTestRemoveFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  RealDiskInterface *this_00;
  char *in_RSI;
  string local_40;
  
  pTVar2 = g_current_test;
  bVar3 = DiskInterfaceTest::Touch((DiskInterfaceTest *)"file-to-remove",in_RSI);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0xd2,"Touch(kFileName)");
  pTVar2 = g_current_test;
  if (bVar3) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"file-to-remove","");
    this_00 = &(this->super_DiskInterfaceTest).disk_;
    iVar4 = RealDiskInterface::RemoveFile(this_00,&local_40);
    testing::Test::Check
              (pTVar2,iVar4 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd3,"0 == disk_.RemoveFile(kFileName)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"file-to-remove","");
    iVar4 = RealDiskInterface::RemoveFile(this_00,&local_40);
    testing::Test::Check
              (pTVar2,iVar4 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd4,"1 == disk_.RemoveFile(kFileName)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"does not exist","");
    iVar4 = RealDiskInterface::RemoveFile(this_00,&local_40);
    testing::Test::Check
              (pTVar2,iVar4 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd5,"1 == disk_.RemoveFile(\"does not exist\")");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, RemoveFile) {
  const char* kFileName = "file-to-remove";
  ASSERT_TRUE(Touch(kFileName));
  EXPECT_EQ(0, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile("does not exist"));
#ifdef _WIN32
  ASSERT_TRUE(Touch(kFileName));
  EXPECT_EQ(0, system((std::string("attrib +R ") + kFileName).c_str()));
  EXPECT_EQ(0, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile(kFileName));
#endif
}